

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O2

void __thiscall
basisu::basisu_frontend::compute_selector_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  vector<unsigned_int> *pvVar1;
  uint *puVar2;
  byte *pbVar3;
  uint32_t cluster_indices_iter;
  ulong uVar4;
  int cluster_index;
  size_t i;
  uint32_t cluster_index_1;
  uint_vec block_selector_cluster_indices;
  uint local_44;
  vector<unsigned_int> local_40;
  
  vector<unsigned_int>::vector(&local_40,(ulong)this->m_total_blocks);
  for (i = 0; (long)i < (long)(int)(this->m_selector_cluster_block_indices).m_size; i = i + 1) {
    pvVar1 = vector<basisu::vector<unsigned_int>_>::operator[]
                       (&this->m_selector_cluster_block_indices,i);
    for (uVar4 = 0; uVar4 < pvVar1->m_size; uVar4 = uVar4 + 1) {
      puVar2 = vector<unsigned_int>::operator[](pvVar1,uVar4);
      puVar2 = vector<unsigned_int>::operator[](&local_40,(ulong)*puVar2);
      *puVar2 = (uint)i;
    }
  }
  this_00 = &this->m_selector_clusters_within_each_parent_cluster;
  vector<basisu::vector<unsigned_int>_>::resize(this_00,0,false);
  vector<basisu::vector<unsigned_int>_>::resize
            (this_00,(ulong)(this->m_selector_parent_cluster_block_indices).m_size,false);
  for (uVar4 = 0; uVar4 < this->m_total_blocks; uVar4 = uVar4 + 1) {
    puVar2 = vector<unsigned_int>::operator[](&local_40,uVar4);
    local_44 = *puVar2;
    pbVar3 = vector<unsigned_char>::operator[](&this->m_block_parent_selector_cluster,uVar4);
    pvVar1 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,(ulong)*pbVar3);
    vector<unsigned_int>::push_back(pvVar1,&local_44);
  }
  uVar4 = 0;
  while( true ) {
    if ((this->m_selector_clusters_within_each_parent_cluster).m_size <= uVar4) {
      free(local_40.m_p);
      return;
    }
    pvVar1 = vector<basisu::vector<unsigned_int>_>::operator[](this_00,uVar4);
    if (pvVar1->m_size == 0) break;
    vector_sort<basisu::vector<unsigned_int>>(pvVar1);
    puVar2 = std::__unique<unsigned_int*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (pvVar1->m_p,pvVar1->m_p + pvVar1->m_size);
    vector<unsigned_int>::erase(pvVar1,puVar2,pvVar1->m_p + pvVar1->m_size);
    uVar4 = uVar4 + 1;
  }
  handle_verify_failure(0x888);
}

Assistant:

void basisu_frontend::compute_selector_clusters_within_each_parent_cluster()
	{
		uint_vec block_selector_cluster_indices(m_total_blocks);

		for (int cluster_index = 0; cluster_index < static_cast<int>(m_selector_cluster_block_indices.size()); cluster_index++)
		{
			const basisu::vector<uint32_t>& cluster_indices = m_selector_cluster_block_indices[cluster_index];

			for (uint32_t cluster_indices_iter = 0; cluster_indices_iter < cluster_indices.size(); cluster_indices_iter++)
			{
				const uint32_t block_index = cluster_indices[cluster_indices_iter];
				
				block_selector_cluster_indices[block_index] = cluster_index;

			} // cluster_indices_iter

		} // cluster_index

		m_selector_clusters_within_each_parent_cluster.resize(0);
		m_selector_clusters_within_each_parent_cluster.resize(m_selector_parent_cluster_block_indices.size());

		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = block_selector_cluster_indices[block_index];
			const uint32_t parent_cluster_index = m_block_parent_selector_cluster[block_index];

			m_selector_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_selector_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_selector_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}